

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O0

int rw::strncmp_ci(char *s1,char *s2,int n)

{
  char cVar1;
  int iVar2;
  int local_24;
  char c2;
  char c1;
  char *pcStack_20;
  int n_local;
  char *s2_local;
  char *s1_local;
  
  local_24 = n;
  pcStack_20 = s2;
  s2_local = s1;
  while( true ) {
    if (local_24 == 0) {
      return 0;
    }
    iVar2 = tolower((int)*s2_local);
    cVar1 = (char)iVar2;
    iVar2 = tolower((int)*pcStack_20);
    if (cVar1 != (char)iVar2) break;
    if (cVar1 == '\0') {
      return 0;
    }
    s2_local = s2_local + 1;
    pcStack_20 = pcStack_20 + 1;
    local_24 = local_24 + -1;
  }
  return (int)cVar1 - (int)(char)iVar2;
}

Assistant:

int
strncmp_ci(const char *s1, const char *s2, int n)
{
	char c1, c2;
	while(n--){
		c1 = tolower(*s1);
		c2 = tolower(*s2);
		if(c1 != c2)
			return c1 - c2;
		if(c1 == '\0')
			return 0;
		s1++;
		s2++;
	}
	return 0;
}